

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalKdevelopGenerator.cxx
# Opt level: O0

bool __thiscall
cmGlobalKdevelopGenerator::CreateFilelistFile
          (cmGlobalKdevelopGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *outputDir,
          string *projectDirIn,string *projectname,string *cmakeFilePattern,string *fileToOpen)

{
  pointer *__lhs;
  cmGeneratorTarget *this_00;
  bool bVar1;
  byte bVar2;
  cmake *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  reference ppcVar3;
  cmMakefile *pcVar4;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__x_00;
  reference ppcVar5;
  reference ppcVar6;
  string *psVar7;
  reference pbVar8;
  char *pcVar9;
  char *pcVar10;
  reference in_path;
  ulong uVar11;
  ostream *poVar12;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar13;
  bool local_8f1;
  undefined1 local_840 [8];
  string ext_1;
  _Self local_800;
  _Self local_7f8;
  const_iterator it_1;
  cmGeneratedFileStream fout;
  undefined1 local_598 [8];
  string completePath;
  ifstream oldFilelist;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_348;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_340;
  const_iterator lt_1;
  int local_32c;
  undefined1 local_318 [8];
  string hname;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2f0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2e8;
  const_iterator ext;
  string local_2c8;
  string local_2a8;
  undefined1 local_288 [8];
  string headerBasename;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_260;
  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_258;
  const_iterator si;
  string local_248;
  string local_228;
  cmGeneratorTarget *local_208;
  cmGeneratorTarget *gt;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_1e0;
  iterator ti;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_198;
  _Base_ptr local_178;
  undefined1 local_170;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_168;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_160;
  const_iterator lt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *listFiles;
  cmMakefile *makefile;
  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  local_140;
  const_iterator it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hdrExts;
  string tmp;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  string filename;
  string projectDir;
  string *cmakeFilePattern_local;
  string *projectname_local;
  string *projectDirIn_local;
  string *outputDir_local;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs_local;
  cmGlobalKdevelopGenerator *this_local;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&filename.field_2 + 8),projectDirIn,"/");
  std::operator+(&local_c0,outputDir,"/");
  std::operator+(&local_a0,&local_c0,projectname);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 &local_a0,".kdevelop.filelist");
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)((long)&tmp.field_2 + 8));
  std::__cxx11::string::string
            ((string *)
             &hdrExts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this_01 = cmGlobalGenerator::GetCMakeInstance
                      ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  __x = cmake::GetHeaderExtensions_abi_cxx11_(this_01);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&it,__x);
  local_140._M_current =
       (cmLocalGenerator **)
       std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(lgs);
  do {
    makefile = (cmMakefile *)
               std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(lgs);
    bVar1 = __gnu_cxx::operator!=
                      (&local_140,
                       (__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                        *)&makefile);
    if (!bVar1) {
      pcVar10 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream((void *)((long)&completePath.field_2 + 8),pcVar10,_S_in);
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&completePath.field_2 +
                                *(long *)(completePath.field_2._8_8_ + -0x18) + 8));
      if (bVar1) {
        while (bVar1 = cmsys::SystemTools::GetLineFromStream
                                 ((istream *)(completePath.field_2._M_local_buf + 8),
                                  (string *)
                                  &hdrExts.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(bool *)0x0,-1
                                 ), bVar1) {
          pcVar10 = (char *)std::__cxx11::string::operator[]
                                      ((ulong)&hdrExts.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (*pcVar10 != '/') {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_598,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&filename.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &hdrExts.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
            pcVar10 = (char *)std::__cxx11::string::c_str();
            bVar1 = cmsys::SystemTools::FileExists(pcVar10);
            if (bVar1) {
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&tmp.field_2 + 8),
                       (value_type *)
                       &hdrExts.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            std::__cxx11::string::~string((string *)local_598);
          }
        }
        std::ifstream::close();
      }
      pcVar10 = (char *)std::__cxx11::string::c_str();
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&it_1,pcVar10,false);
      bVar2 = std::ios::operator!((ios *)((long)&(it_1._M_node[-1]._M_parent)->_M_color +
                                         (long)&it_1._M_node));
      if ((bVar2 & 1) == 0) {
        std::__cxx11::string::operator=((string *)fileToOpen,"");
        local_7f8._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&tmp.field_2 + 8));
        while( true ) {
          local_800._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&tmp.field_2 + 8));
          bVar1 = std::operator!=(&local_7f8,&local_800);
          if (!bVar1) break;
          in_path = std::
                    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&local_7f8);
          pcVar10 = (char *)std::__cxx11::string::c_str();
          cmsys::SystemTools::CollapseFullPath((string *)((long)&ext_1.field_2 + 8),in_path,pcVar10)
          ;
          std::__cxx11::string::operator=
                    ((string *)
                     &hdrExts.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (string *)(ext_1.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(ext_1.field_2._M_local_buf + 8));
          uVar11 = std::__cxx11::string::empty();
          if ((uVar11 & 1) != 0) {
            cmsys::SystemTools::GetFilenameExtension
                      ((string *)local_840,
                       (string *)
                       &hdrExts.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_840,".c");
            if (((((bVar1) ||
                  (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_840,".cc"), bVar1)) ||
                 (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_840,".cpp"), bVar1)) ||
                ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_840,".cxx"), bVar1 ||
                 (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_840,".C"), bVar1)))) ||
               ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_840,".h"), bVar1 ||
                (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_840,".hpp"), bVar1)))) {
              std::__cxx11::string::operator=
                        ((string *)fileToOpen,
                         (string *)
                         &hdrExts.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            std::__cxx11::string::~string((string *)local_840);
          }
          pcVar10 = (char *)std::__cxx11::string::c_str();
          cmsys::SystemTools::ReplaceString
                    ((string *)
                     &hdrExts.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar10,"");
          uVar11 = std::__cxx11::string::empty();
          if (((uVar11 & 1) == 0) &&
             (pcVar10 = (char *)std::__cxx11::string::operator[]
                                          ((ulong)&hdrExts.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          ), *pcVar10 != '/')) {
            pcVar10 = (char *)std::__cxx11::string::c_str();
            poVar12 = std::operator<<((ostream *)&it_1,pcVar10);
            std::operator<<(poVar12,"\n");
          }
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&local_7f8,0);
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&it_1);
      std::ifstream::~ifstream((void *)((long)&completePath.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&it);
      std::__cxx11::string::~string
                ((string *)
                 &hdrExts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&tmp.field_2 + 8));
      std::__cxx11::string::~string((string *)local_80);
      std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
      return this_local._7_1_;
    }
    ppcVar3 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&local_140);
    pcVar4 = cmLocalGenerator::GetMakefile(*ppcVar3);
    lt._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         cmMakefile::GetListFiles_abi_cxx11_(pcVar4);
    local_160._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)lt._M_current);
    while( true ) {
      local_168._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(lt._M_current);
      bVar1 = __gnu_cxx::operator!=(&local_160,&local_168);
      if (!bVar1) break;
      pbVar8 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_160);
      std::__cxx11::string::operator=
                ((string *)
                 &hdrExts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pbVar8);
      pcVar10 = (char *)std::__cxx11::string::c_str();
      cmsys::SystemTools::ReplaceString
                ((string *)
                 &hdrExts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar10,"");
      pcVar10 = (char *)std::__cxx11::string::operator[]
                                  ((ulong)&hdrExts.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (*pcVar10 != '/') {
        pcVar10 = (char *)std::__cxx11::string::c_str();
        pcVar9 = cmake::GetCMakeFilesDirectoryPostSlash();
        pcVar10 = strstr(pcVar10,pcVar9);
        if (pcVar10 == (char *)0x0) {
          pVar13 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&tmp.field_2 + 8),
                            (value_type *)
                            &hdrExts.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_178 = (_Base_ptr)pVar13.first._M_node;
          local_170 = pVar13.second;
          cmsys::SystemTools::GetFilenameName
                    (&local_198,
                     (string *)
                     &hdrExts.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          __lhs = &hdrExts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::operator=((string *)__lhs,(string *)&local_198);
          std::__cxx11::string::~string((string *)&local_198);
          bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,"CMakeLists.txt");
          if (bVar1) {
            pcVar10 = (char *)std::__cxx11::string::c_str();
            pcVar10 = strstr(pcVar10,".cmake");
            if (pcVar10 == (char *)0x0) {
              std::operator+(&local_1b8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &hdrExts.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,";");
              std::__cxx11::string::operator+=((string *)cmakeFilePattern,(string *)&local_1b8);
              std::__cxx11::string::~string((string *)&local_1b8);
            }
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_160,0);
    }
    ppcVar3 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&local_140);
    __x_00 = cmLocalGenerator::GetGeneratorTargets(*ppcVar3);
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti,__x_00);
    local_1e0._M_current =
         (cmGeneratorTarget **)
         std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                   ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti);
    while( true ) {
      sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)
                               &ti);
      bVar1 = __gnu_cxx::operator!=
                        (&local_1e0,
                         (__normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                          *)&sources.
                             super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) break;
      std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
                ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&gt);
      ppcVar5 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_1e0);
      this_00 = *ppcVar5;
      local_208 = this_00;
      pcVar4 = cmTarget::GetMakefile(this_00->Target);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_248,"CMAKE_BUILD_TYPE",(allocator *)((long)&si._M_current + 7));
      pcVar10 = cmMakefile::GetSafeDefinition(pcVar4,&local_248);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_228,pcVar10,(allocator *)((long)&si._M_current + 6));
      cmGeneratorTarget::GetSourceFiles
                (this_00,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&gt,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      std::allocator<char>::~allocator((allocator<char> *)((long)&si._M_current + 6));
      std::__cxx11::string::~string((string *)&local_248);
      std::allocator<char>::~allocator((allocator<char> *)((long)&si._M_current + 7));
      local_260._M_current =
           (cmSourceFile **)
           std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                     ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&gt);
      __gnu_cxx::
      __normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
      ::__normal_iterator<cmSourceFile**>
                ((__normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
                  *)&local_258,&local_260);
      while( true ) {
        headerBasename.field_2._8_8_ =
             std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                       ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&gt);
        bVar1 = __gnu_cxx::operator!=
                          (&local_258,
                           (__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                            *)((long)&headerBasename.field_2 + 8));
        if (!bVar1) break;
        ppcVar6 = __gnu_cxx::
                  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                  ::operator*(&local_258);
        psVar7 = cmSourceFile::GetFullPath(*ppcVar6,(string *)0x0);
        std::__cxx11::string::operator=
                  ((string *)
                   &hdrExts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)psVar7);
        cmsys::SystemTools::GetFilenamePath
                  ((string *)local_288,
                   (string *)
                   &hdrExts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::operator+=((string *)local_288,"/");
        cmsys::SystemTools::GetFilenameWithoutExtension
                  (&local_2a8,
                   (string *)
                   &hdrExts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::operator+=((string *)local_288,(string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_2a8);
        pcVar10 = (char *)std::__cxx11::string::c_str();
        cmsys::SystemTools::ReplaceString
                  ((string *)
                   &hdrExts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar10,"");
        bVar1 = false;
        pcVar10 = (char *)std::__cxx11::string::operator[]
                                    ((ulong)&hdrExts.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_8f1 = false;
        if (*pcVar10 != '/') {
          pcVar10 = (char *)std::__cxx11::string::c_str();
          pcVar9 = cmake::GetCMakeFilesDirectoryPostSlash();
          pcVar10 = strstr(pcVar10,pcVar9);
          local_8f1 = false;
          if (pcVar10 == (char *)0x0) {
            cmsys::SystemTools::GetFilenameExtension
                      (&local_2c8,
                       (string *)
                       &hdrExts.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            bVar1 = true;
            local_8f1 = std::operator!=(&local_2c8,".moc");
          }
        }
        if (bVar1) {
          std::__cxx11::string::~string((string *)&local_2c8);
        }
        if (local_8f1 != false) {
          pVar13 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&tmp.field_2 + 8),
                            (value_type *)
                            &hdrExts.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          ext._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               pVar13.first._M_node;
          local_2f0._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&it);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          ::__normal_iterator<std::__cxx11::string*>
                    ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      *)&local_2e8,&local_2f0);
          while( true ) {
            hname.field_2._8_8_ =
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&it);
            bVar1 = __gnu_cxx::operator!=
                              (&local_2e8,
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&hname.field_2 + 8));
            if (!bVar1) break;
            std::__cxx11::string::string((string *)local_318,(string *)local_288);
            std::__cxx11::string::operator+=((string *)local_318,".");
            pbVar8 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_2e8);
            std::__cxx11::string::operator+=((string *)local_318,(string *)pbVar8);
            pcVar10 = (char *)std::__cxx11::string::c_str();
            bVar1 = cmsys::SystemTools::FileExists(pcVar10);
            if (bVar1) {
              pcVar10 = (char *)std::__cxx11::string::c_str();
              cmsys::SystemTools::ReplaceString((string *)local_318,pcVar10,"");
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&tmp.field_2 + 8),(value_type *)local_318);
              local_32c = 0xe;
            }
            else {
              local_32c = 0;
            }
            std::__cxx11::string::~string((string *)local_318);
            if (local_32c != 0) break;
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_2e8);
          }
        }
        std::__cxx11::string::~string((string *)local_288);
        lt_1._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __gnu_cxx::
             __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
             ::operator++(&local_258,0);
      }
      local_340._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(lt._M_current);
      while( true ) {
        local_348._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(lt._M_current);
        bVar1 = __gnu_cxx::operator!=(&local_340,&local_348);
        if (!bVar1) break;
        pbVar8 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_340);
        std::__cxx11::string::operator=
                  ((string *)
                   &hdrExts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pbVar8);
        pcVar10 = (char *)std::__cxx11::string::c_str();
        cmsys::SystemTools::ReplaceString
                  ((string *)
                   &hdrExts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar10,"");
        pcVar10 = (char *)std::__cxx11::string::operator[]
                                    ((ulong)&hdrExts.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (*pcVar10 != '/') {
          pcVar10 = (char *)std::__cxx11::string::c_str();
          pcVar9 = cmake::GetCMakeFilesDirectoryPostSlash();
          pcVar10 = strstr(pcVar10,pcVar9);
          if (pcVar10 == (char *)0x0) {
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&tmp.field_2 + 8),
                     (value_type *)
                     &hdrExts.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_340,0);
      }
      std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
                ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&gt);
      __gnu_cxx::
      __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
      ::operator++(&local_1e0,0);
    }
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti);
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&local_140,0);
  } while( true );
}

Assistant:

bool cmGlobalKdevelopGenerator
::CreateFilelistFile(const std::vector<cmLocalGenerator*>& lgs,
                     const std::string& outputDir,
                     const std::string& projectDirIn,
                     const std::string& projectname,
                     std::string& cmakeFilePattern,
                     std::string& fileToOpen)
{
  std::string projectDir = projectDirIn + "/";
  std::string filename = outputDir+ "/" + projectname +".kdevelop.filelist";

  std::set<std::string> files;
  std::string tmp;

  std::vector<std::string> hdrExts =
      this->GlobalGenerator->GetCMakeInstance()->GetHeaderExtensions();

  for (std::vector<cmLocalGenerator*>::const_iterator it=lgs.begin();
       it!=lgs.end(); it++)
    {
    cmMakefile* makefile=(*it)->GetMakefile();
    const std::vector<std::string>& listFiles=makefile->GetListFiles();
    for (std::vector<std::string>::const_iterator lt=listFiles.begin();
         lt!=listFiles.end(); lt++)
      {
      tmp=*lt;
      cmSystemTools::ReplaceString(tmp, projectDir.c_str(), "");
      // make sure the file is part of this source tree
      if ((tmp[0]!='/') &&
          (strstr(tmp.c_str(),
                  cmake::GetCMakeFilesDirectoryPostSlash())==0))
        {
        files.insert(tmp);
        tmp=cmSystemTools::GetFilenameName(tmp);
        //add all files which dont match the default
        // */CMakeLists.txt;*cmake; to the file pattern
        if ((tmp!="CMakeLists.txt")
            && (strstr(tmp.c_str(), ".cmake")==0))
          {
          cmakeFilePattern+=tmp+";";
          }
        }
      }

    //get all sources
    std::vector<cmGeneratorTarget*> targets=(*it)->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::iterator ti = targets.begin();
         ti != targets.end(); ti++)
      {
      std::vector<cmSourceFile*> sources;
      cmGeneratorTarget* gt = *ti;
      gt->GetSourceFiles(sources, gt->Target->GetMakefile()
                                    ->GetSafeDefinition("CMAKE_BUILD_TYPE"));
      for (std::vector<cmSourceFile*>::const_iterator si=sources.begin();
           si!=sources.end(); si++)
        {
        tmp=(*si)->GetFullPath();
        std::string headerBasename=cmSystemTools::GetFilenamePath(tmp);
        headerBasename+="/";
        headerBasename+=cmSystemTools::GetFilenameWithoutExtension(tmp);

        cmSystemTools::ReplaceString(tmp, projectDir.c_str(), "");

        if ((tmp[0]!='/')  &&
            (strstr(tmp.c_str(),
                  cmake::GetCMakeFilesDirectoryPostSlash())==0) &&
           (cmSystemTools::GetFilenameExtension(tmp)!=".moc"))
          {
          files.insert(tmp);

          // check if there's a matching header around
          for(std::vector<std::string>::const_iterator
                ext = hdrExts.begin(); ext != hdrExts.end(); ++ext)
            {
            std::string hname=headerBasename;
            hname += ".";
            hname += *ext;
            if(cmSystemTools::FileExists(hname.c_str()))
              {
              cmSystemTools::ReplaceString(hname, projectDir.c_str(), "");
              files.insert(hname);
              break;
              }
            }
          }
        }
      for (std::vector<std::string>::const_iterator lt=listFiles.begin();
           lt!=listFiles.end(); lt++)
        {
        tmp=*lt;
        cmSystemTools::ReplaceString(tmp, projectDir.c_str(), "");
        if ((tmp[0]!='/') &&
            (strstr(tmp.c_str(),
                    cmake::GetCMakeFilesDirectoryPostSlash())==0))
          {
          files.insert(tmp);
          }
        }
      }
    }

  //check if the output file already exists and read it
  //insert all files which exist into the set of files
  cmsys::ifstream oldFilelist(filename.c_str());
  if (oldFilelist)
    {
    while (cmSystemTools::GetLineFromStream(oldFilelist, tmp))
      {
      if (tmp[0]=='/')
        {
        continue;
        }
      std::string completePath=projectDir+tmp;
      if (cmSystemTools::FileExists(completePath.c_str()))
        {
        files.insert(tmp);
        }
      }
    oldFilelist.close();
    }

  //now write the new filename
  cmGeneratedFileStream fout(filename.c_str());
  if(!fout)
    {
    return false;
    }

  fileToOpen="";
  for (std::set<std::string>::const_iterator it=files.begin();
       it!=files.end(); it++)
    {
    // get the full path to the file
    tmp=cmSystemTools::CollapseFullPath(*it, projectDir.c_str());
    // just select the first source file
    if (fileToOpen.empty())
    {
       std::string ext = cmSystemTools::GetFilenameExtension(tmp);
       if ((ext==".c") || (ext==".cc") || (ext==".cpp")  || (ext==".cxx")
           || (ext==".C") || (ext==".h") || (ext==".hpp"))
       {
       fileToOpen=tmp;
       }
    }
    // make it relative to the project dir
    cmSystemTools::ReplaceString(tmp, projectDir.c_str(), "");
    // only put relative paths
    if (!tmp.empty() && tmp[0] != '/')
      {
      fout << tmp.c_str() <<"\n";
      }
    }
  return true;
}